

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAligned
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  bool bVar1;
  AllocationPolicy *pAVar2;
  LogMessage *pLVar3;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  AllocationPolicy *local_28;
  AllocationPolicy *policy_local;
  size_t n_local;
  SerialArena *this_local;
  
  local_28 = policy;
  policy_local = (AllocationPolicy *)n;
  n_local = (size_t)this;
  pAVar2 = (AllocationPolicy *)AlignUpTo8(n);
  local_61 = 0;
  if (pAVar2 != policy_local) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xd6);
    local_61 = 1;
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: (internal::AlignUpTo8(n)) == (n): ");
    LogFinisher::operator=(local_75,pLVar3);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  local_b1 = 0;
  if (this->limit_ < this->ptr_) {
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xd7);
    local_b1 = 1;
    pLVar3 = LogMessage::operator<<(&local_b0,"CHECK failed: (limit_) >= (ptr_): ");
    LogFinisher::operator=(&local_b2,pLVar3);
  }
  if ((local_b1 & 1) != 0) {
    LogMessage::~LogMessage(&local_b0);
  }
  bVar1 = HasSpace(this,(size_t)policy_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (SerialArena *)AllocateFromExisting(this,(size_t)policy_local);
  }
  else {
    this_local = (SerialArena *)AllocateAlignedFallback(this,(size_t)policy_local,local_28);
  }
  return this_local;
}

Assistant:

void* AllocateAligned(size_t n, const AllocationPolicy* policy) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    GOOGLE_DCHECK_GE(limit_, ptr_);
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n))) {
      return AllocateAlignedFallback(n, policy);
    }
    return AllocateFromExisting(n);
  }